

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void BM_Check1(int n)

{
  LogMessage LStack_28;
  CheckOpString local_18;
  
  do {
    if (n < 1) {
      return;
    }
    n = n + -1;
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x73,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x74,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x75,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x76,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x77,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x78,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_18.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x79,&local_18);
      google::LogMessage::stream(&LStack_28);
      goto LAB_001137d6;
    }
    local_18.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
  } while (local_18.str_ == (string *)0x0);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x7a,&local_18);
  google::LogMessage::stream(&LStack_28);
LAB_001137d6:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}